

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

void * rw::xbox::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  long lVar1;
  
  lVar1 = (long)offset;
  *(undefined2 *)((long)object + lVar1 + 0x18) = 0;
  *(undefined4 *)((long)object + lVar1 + 0x1c) = 0;
  *(undefined8 *)((long)object + lVar1) = 0;
  ((undefined8 *)((long)object + lVar1))[1] = 0;
  *(undefined4 *)((long)object + lVar1 + 0x10) = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	XboxRaster *raster = PLUGINOFFSET(XboxRaster, object, offset);
	raster->texture = nil;
	raster->palette = nil;
	raster->format = 0;
	raster->hasAlpha = 0;
	raster->customFormat = 0;
	raster->unknownFlag = 0;
	return object;
}